

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O0

UStringTrieResult __thiscall icu_63::UCharsTrie::nextImpl(UCharsTrie *this,UChar *pos,int32_t uchar)

{
  UStringTrieResult UVar1;
  uint node_00;
  UStringTrieResult local_3c;
  uint local_28;
  int32_t length;
  int32_t node;
  int32_t uchar_local;
  UChar *pos_local;
  UCharsTrie *this_local;
  
  _node = pos + 1;
  local_28 = (uint)(ushort)*pos;
  while( true ) {
    if (local_28 < 0x30) {
      UVar1 = branchNext(this,_node,local_28,uchar);
      return UVar1;
    }
    if (local_28 < 0x40) break;
    if ((local_28 & 0x8000) != 0) goto LAB_00366bc8;
    _node = skipNodeValue(_node,local_28);
    local_28 = local_28 & 0x3f;
  }
  if (uchar == (uint)(ushort)*_node) {
    this->remainingMatchLength_ = local_28 - 0x31;
    this->pos_ = _node + 1;
    if (((int)(local_28 - 0x31) < 0) && (node_00 = (uint)(ushort)_node[1], 0x3f < node_00)) {
      local_3c = valueResult(node_00);
    }
    else {
      local_3c = USTRINGTRIE_NO_VALUE;
    }
    return local_3c;
  }
LAB_00366bc8:
  stop(this);
  return USTRINGTRIE_NO_MATCH;
}

Assistant:

UStringTrieResult
UCharsTrie::nextImpl(const UChar *pos, int32_t uchar) {
    int32_t node=*pos++;
    for(;;) {
        if(node<kMinLinearMatch) {
            return branchNext(pos, node, uchar);
        } else if(node<kMinValueLead) {
            // Match the first of length+1 units.
            int32_t length=node-kMinLinearMatch;  // Actual match length minus 1.
            if(uchar==*pos++) {
                remainingMatchLength_=--length;
                pos_=pos;
                return (length<0 && (node=*pos)>=kMinValueLead) ?
                        valueResult(node) : USTRINGTRIE_NO_VALUE;
            } else {
                // No match.
                break;
            }
        } else if(node&kValueIsFinal) {
            // No further matching units.
            break;
        } else {
            // Skip intermediate value.
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
    stop();
    return USTRINGTRIE_NO_MATCH;
}